

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::logger<>(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
           *this,string_view name)

{
  initializer_list<std::shared_ptr<lwlog::interface::sink>_> __l;
  bool bVar1;
  registry *prVar2;
  _Variant_storage_alias<std::reference_wrapper<int>,_std::reference_wrapper<float>,_std::reference_wrapper<double>,_std::reference_wrapper<std::__cxx11::basic_string<char>_>,_std::reference_wrapper<std::basic_string_view<char>_>,_std::reference_wrapper<lwlog::level>_>
  in_stack_fffffffffffffef8;
  shared_ptr<lwlog::interface::sink> *local_c8;
  string_view local_a8;
  variant<std::reference_wrapper<int>,std::reference_wrapper<float>,std::reference_wrapper<double>,std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,std::reference_wrapper<lwlog::level>>
  local_98 [16];
  string_view local_88;
  variant<std::reference_wrapper<int>,std::reference_wrapper<float>,std::reference_wrapper<double>,std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,std::reference_wrapper<lwlog::level>>
  local_78 [16];
  string_view local_68;
  shared_ptr<lwlog::interface::sink> *local_58;
  shared_ptr<lwlog::interface::sink> local_50;
  shared_ptr<lwlog::interface::sink> local_40 [2];
  logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
  *local_20;
  logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
  *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
                *)name._M_len;
  local_20 = this;
  interface::logger::logger(&this->super_logger);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_0015e200;
  (this->m_name)._M_len = (size_t)this_local;
  (this->m_name)._M_str = (char *)name_local._M_len;
  synchronous_policy::
  backend<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::spsc_model_policy>
  ::backend(&this->m_backend);
  details::topic_registry<lwlog::enable_topics>::topic_registry(&this->m_topics);
  synchronous_policy::
  init<lwlog::configuration<lwlog::disable_local_time,lwlog::enable_thread_id,lwlog::enable_process_id,lwlog::enable_topics>,lwlog::spsc_model_policy>
            (&this->m_backend);
  prVar2 = registry::instance();
  bVar1 = registry::is_registry_automatic(prVar2);
  if (bVar1) {
    prVar2 = registry::instance();
    registry::register_logger(prVar2,&this->super_logger);
  }
  local_58 = &local_50;
  sinks::
  sink_factory<lwlog::sinks::stdout_sink<lwlog::immediate_flush_policy,_lwlog::single_threaded_policy>_>
  ::request<>();
  local_40[0].super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_50;
  local_40[0].super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  __l._M_len = 1;
  __l._M_array = (iterator)
                 local_40[0].super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ::operator=(&(this->m_backend).sink_storage,__l);
  local_c8 = local_40;
  do {
    local_c8 = local_c8 + -1;
    std::shared_ptr<lwlog::interface::sink>::~shared_ptr(local_c8);
  } while (local_c8 != &local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"{name}");
  std::
  variant<std::reference_wrapper<int>,std::reference_wrapper<float>,std::reference_wrapper<double>,std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,std::reference_wrapper<lwlog::level>>
  ::
  variant<std::basic_string_view<char,std::char_traits<char>>&,void,void,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,void>
            (local_78,&this->m_name);
  add_attribute(this,local_68,(attrib_value)in_stack_fffffffffffffef8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"%n");
  std::
  variant<std::reference_wrapper<int>,std::reference_wrapper<float>,std::reference_wrapper<double>,std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,std::reference_wrapper<lwlog::level>>
  ::
  variant<std::basic_string_view<char,std::char_traits<char>>&,void,void,std::reference_wrapper<std::basic_string_view<char,std::char_traits<char>>>,void>
            (local_98,&this->m_name);
  add_attribute(this,local_88,(attrib_value)in_stack_fffffffffffffef8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"/");
  set_topic_separator(this,local_a8);
  return;
}

Assistant:

logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::logger(std::string_view name,
		SinkParams&&... params)
		: m_name{ name }
	{
		LogExecutionPolicy::template init<Config>(m_backend);

		if(registry::instance().is_registry_automatic()) 
			registry::instance().register_logger(this);

		m_backend.sink_storage = { sinks::sink_factory<Sinks<FlushPolicy, ThreadingPolicy>>::request(
			std::forward<SinkParams>(params)...
		)... };

		logger::add_attribute("{name}", m_name);
		logger::add_attribute("%n", m_name);

		logger::set_topic_separator("/");
	}